

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugContext.cpp
# Opt level: O3

void __thiscall Js::DebugContext::Close(DebugContext *this)

{
  ProbeContainer *this_00;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if ((this->field_0x1c & 1) == 0) {
    if (this->scriptContext->isScriptContextActuallyClosed == true) {
      this->field_0x1c = this->field_0x1c | 1;
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DebugContext.cpp"
                                  ,0x2b,"(this->scriptContext->IsActuallyClosed())",
                                  "Closing DebugContext before ScriptContext close might have consequences"
                                 );
      if (!bVar2) {
LAB_008a6098:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
      this->field_0x1c = this->field_0x1c | 1;
      if (this->scriptContext == (ScriptContext *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DebugContext.cpp"
                                    ,0x31,"(this->scriptContext != nullptr)",
                                    "this->scriptContext != nullptr");
        if (!bVar2) goto LAB_008a6098;
        *puVar3 = 0;
      }
    }
    if (this->diagProbesContainer != (ProbeContainer *)0x0) {
      ProbeContainer::Close(this->diagProbesContainer);
      this_00 = this->diagProbesContainer;
      ProbeContainer::~ProbeContainer(this_00);
      Memory::HeapAllocator::Free(&Memory::HeapAllocator::Instance,this_00,0x70);
      this->diagProbesContainer = (ProbeContainer *)0x0;
    }
    if (this->hostDebugContext != (HostDebugContext *)0x0) {
      (**this->hostDebugContext->_vptr_HostDebugContext)();
      this->hostDebugContext = (HostDebugContext *)0x0;
    }
  }
  return;
}

Assistant:

void DebugContext::Close()
    {
        if (this->isClosed)
        {
            return;
        }

        AssertMsg(this->scriptContext->IsActuallyClosed(), "Closing DebugContext before ScriptContext close might have consequences");

        this->isClosed = true;

        // Release all memory and do all cleanup. No operation should be done after isClosed is set

        Assert(this->scriptContext != nullptr);

        if (this->diagProbesContainer != nullptr)
        {
            this->diagProbesContainer->Close();
            HeapDelete(this->diagProbesContainer);
            this->diagProbesContainer = nullptr;
        }

        if (this->hostDebugContext != nullptr)
        {
            this->hostDebugContext->Delete();
            this->hostDebugContext = nullptr;
        }
    }